

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseReader.cpp
# Opt level: O2

EventRegistry * __thiscall
license::LicenseReader::readLicenses
          (EventRegistry *__return_storage_ptr__,LicenseReader *this,string *product,
          vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>
          *licenseInfoOut)

{
  LocatorStrategy *pLVar1;
  pointer puVar2;
  FUNCTION_RETURN FVar3;
  SI_Error SVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  mapped_type *pmVar8;
  undefined8 extraout_RAX;
  pointer puVar9;
  _List_node_base *p_Var10;
  pointer licenseLocationId;
  allocator local_221;
  EventRegistry *local_220;
  ulong local_218;
  string *local_210;
  TNamesDepend keys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  licenseLocations;
  vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
  locator_strategies;
  string license;
  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_> local_178;
  string product_up;
  key_type local_e8;
  FullLicenseInfo licInfo;
  
  locator_strategies.
  super__Vector_base<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  locator_strategies.
  super__Vector_base<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  locator_strategies.
  super__Vector_base<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_210 = product;
  FVar3 = locate::LocatorFactory::get_active_strategies(&locator_strategies,this->licenseLocation);
  EventRegistry::EventRegistry(__return_storage_ptr__);
  local_220 = __return_storage_ptr__;
  if (FVar3 == FUNC_RET_OK) {
    toupper_copy(&product_up,local_210);
    puVar2 = locator_strategies.
             super__Vector_base<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_218 = 0;
    for (puVar9 = locator_strategies.
                  super__Vector_base<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar2; puVar9 = puVar9 + 1)
    {
      pLVar1 = (puVar9->_M_t).
               super___uniq_ptr_impl<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
               ._M_t.
               super__Tuple_impl<0UL,_license::locate::LocatorStrategy_*,_std::default_delete<license::locate::LocatorStrategy>_>
               .super__Head_base<0UL,_license::locate::LocatorStrategy_*,_false>._M_head_impl;
      (*pLVar1->_vptr_LocatorStrategy[1])(&licenseLocations,pLVar1,local_220);
      if (licenseLocations.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          licenseLocations.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_178.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_178.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_178.m_pFileComment = (char *)0x0;
        local_178.m_pData = (char *)0x0;
        local_178.m_uDataLen = 0;
        local_178.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_178.m_data._M_t._M_impl.super__Rb_tree_header._M_header;
        local_178.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_178.m_strings.
        super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
        ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_178.m_strings;
        local_178.m_strings.
        super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
        ._M_impl._M_node._M_size._0_7_ = 0;
        local_178._95_4_ = 0;
        local_178.m_bSpaces = true;
        local_178.m_nOrder = 0;
        local_178.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             local_178.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_178.m_strings.
        super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
        ._M_impl._M_node.super__List_node_base._M_prev =
             local_178.m_strings.
             super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
             ._M_impl._M_node.super__List_node_base._M_next;
        for (licenseLocationId =
                  licenseLocations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
            licenseLocationId !=
            licenseLocations.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; licenseLocationId = licenseLocationId + 1) {
          CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Reset(&local_178);
          pLVar1 = (puVar9->_M_t).
                   super___uniq_ptr_impl<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_license::locate::LocatorStrategy_*,_std::default_delete<license::locate::LocatorStrategy>_>
                   .super__Head_base<0UL,_license::locate::LocatorStrategy_*,_false>._M_head_impl;
          std::__cxx11::string::string
                    ((string *)&licInfo,(licenseLocationId->_M_dataplus)._M_p,(allocator *)&local_e8
                    );
          (*pLVar1->_vptr_LocatorStrategy[2])(&license,pLVar1,&licInfo);
          std::__cxx11::string::~string((string *)&licInfo);
          SVar4 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::LoadData
                            (&local_178,license._M_dataplus._M_p,license._M_string_length);
          if (SVar4 < SI_OK) {
            EventRegistry::addEvent(local_220,FILE_FORMAT_NOT_RECOGNIZED,licenseLocationId);
          }
          else {
            iVar5 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::
                    GetSectionSize(&local_178,product_up._M_dataplus._M_p);
            if (iVar5 < 1) {
              EventRegistry::addEvent(local_220,PARALLELS,licenseLocationId);
            }
            else {
              EventRegistry::addEvent(local_220,PRODUCT_FOUND,licenseLocationId);
              pcVar6 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                                 (&local_178,product_up._M_dataplus._M_p,"sig",(char *)0x0,
                                  (bool *)0x0);
              lVar7 = CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::
                      GetLongValue(&local_178,product_up._M_dataplus._M_p,"lic_ver",-1,(bool *)0x0);
              if ((pcVar6 == (char *)0x0) || (lVar7 != 200)) {
                EventRegistry::addEvent(local_220,HV,licenseLocationId);
              }
              else {
                keys.
                super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&keys;
                keys.
                super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                ._M_impl._M_node._M_size = 0;
                keys.
                super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                ._M_impl._M_node.super__List_node_base._M_prev =
                     keys.
                     super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                     ._M_impl._M_node.super__List_node_base._M_next;
                CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetAllKeys
                          (&local_178,product_up._M_dataplus._M_p,
                           (TNamesDepend *)
                           keys.
                           super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                           ._M_impl._M_node.super__List_node_base._M_next);
                std::__cxx11::string::string((string *)&local_e8,pcVar6,&local_221);
                FullLicenseInfo::FullLicenseInfo(&licInfo,licenseLocationId,local_210,&local_e8);
                std::__cxx11::string::~string((string *)&local_e8);
                p_Var10 = (_List_node_base *)&keys;
                while (p_Var10 = (((_List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                                    *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base.
                                 _M_next, p_Var10 != (_List_node_base *)&keys) {
                  CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::GetValue
                            (&local_178,product_up._M_dataplus._M_p,(char *)p_Var10[1]._M_next,
                             (char *)0x0,(bool *)0x0);
                  std::__cxx11::string::string
                            ((string *)&local_e8,(char *)p_Var10[1]._M_next,&local_221);
                  pmVar8 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](&licInfo.m_limits,&local_e8);
                  std::__cxx11::string::assign((char *)pmVar8);
                  std::__cxx11::string::~string((string *)&local_e8);
                }
                std::vector<license::FullLicenseInfo,_std::allocator<license::FullLicenseInfo>_>::
                push_back(licenseInfoOut,&licInfo);
                FullLicenseInfo::~FullLicenseInfo(&licInfo);
                std::__cxx11::
                _List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                ::_M_clear(&keys.
                            super__List_base<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry,_std::allocator<CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::Entry>_>
                          );
                local_218 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
              }
            }
          }
          std::__cxx11::string::~string((string *)&license);
        }
        CSimpleIniTempl<char,_SI_GenericNoCase<char>,_SI_ConvertA<char>_>::~CSimpleIniTempl
                  (&local_178);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&licenseLocations);
    }
    if ((local_218 & 1) == 0) {
      EventRegistry::turnWarningsIntoErrors(local_220);
    }
    std::__cxx11::string::~string((string *)&product_up);
    __return_storage_ptr__ = local_220;
  }
  else {
    EventRegistry::addEvent(__return_storage_ptr__,IFF_UP,(char *)0x0,(char *)0x0);
    EventRegistry::turnWarningsIntoErrors(__return_storage_ptr__);
  }
  std::
  vector<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>,_std::allocator<std::unique_ptr<license::locate::LocatorStrategy,_std::default_delete<license::locate::LocatorStrategy>_>_>_>
  ::~vector(&locator_strategies);
  return __return_storage_ptr__;
}

Assistant:

EventRegistry LicenseReader::readLicenses(const string &product, vector<FullLicenseInfo> &licenseInfoOut) const {
	vector<unique_ptr<locate::LocatorStrategy>> locator_strategies;
	FUNCTION_RETURN ret = locate::LocatorFactory::get_active_strategies(locator_strategies, licenseLocation);
	EventRegistry eventRegistry;
	if (ret != FUNC_RET_OK) {
		eventRegistry.addEvent(LICENSE_FILE_NOT_FOUND);
		eventRegistry.turnWarningsIntoErrors();
		return eventRegistry;
	}

	bool atLeastOneLicenseComplete = false;
	const string product_up = toupper_copy(product);
	const char *productNamePtr = product_up.c_str();
	for (unique_ptr<locate::LocatorStrategy> &locator : locator_strategies) {
		vector<string> licenseLocations = locator->license_locations(eventRegistry);
		if (licenseLocations.size() == 0) {
			continue;
		}
		CSimpleIniA ini;
		for (auto it = licenseLocations.begin(); it != licenseLocations.end(); it++) {
			ini.Reset();
			const string license = locator->retrieve_license_content((*it).c_str());
			const SI_Error rc = ini.LoadData(license.c_str(), license.size());
			if (rc < 0) {
				eventRegistry.addEvent(FILE_FORMAT_NOT_RECOGNIZED, *it);
				continue;
			}
			const int sectionSize = ini.GetSectionSize(productNamePtr);
			if (sectionSize <= 0) {
				eventRegistry.addEvent(PRODUCT_NOT_LICENSED, *it);
				continue;
			} else {
				eventRegistry.addEvent(PRODUCT_FOUND, *it);
			}
			/*
			 *  sw_version_from = (optional int)
			 *  sw_version_to = (optional int)
			 *  from_date = YYYY-MM-DD (optional)
			 *  to_date  = YYYY-MM-DD (optional)
			 *  client_signature = XXXX-XXXX-XXXX (optional string 16)
			 *  sig = XXXXXXXXXX (mandatory, 1024)
			 *  application_data = xxxxxxxxx (optional string 16)
			 */
			const char *license_signature = ini.GetValue(productNamePtr, LICENSE_SIGNATURE, nullptr);
			long license_version = ini.GetLongValue(productNamePtr, LICENSE_VERSION, -1);
			if (license_signature != nullptr && license_version == 200) {
				CSimpleIniA::TNamesDepend keys;
				ini.GetAllKeys(productNamePtr, keys);
				FullLicenseInfo licInfo(*it, product, license_signature);
				for (auto &it : keys) {
					licInfo.m_limits[it.pItem] = ini.GetValue(productNamePtr, it.pItem, nullptr);
				}
				licenseInfoOut.push_back(licInfo);
				atLeastOneLicenseComplete = true;
			} else {
				eventRegistry.addEvent(LICENSE_MALFORMED, *it);
			}
		}
	}
	if (!atLeastOneLicenseComplete) {
		eventRegistry.turnWarningsIntoErrors();
	}
	return eventRegistry;
}